

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3Utf16to8(sqlite3 *db,void *z,int nByte,u8 enc)

{
  long in_FS_OFFSET;
  MemValue local_58;
  char *pcStack_50;
  undefined8 uStack_48;
  sqlite3 *local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_48 = 0;
  uStack_38 = 0;
  local_30 = 0;
  local_58.r = 0.0;
  pcStack_50 = (char *)0x0;
  uStack_28 = 0;
  local_40 = db;
  sqlite3VdbeMemSetStr((Mem *)&local_58,(char *)z,(long)nByte,'\x02',(_func_void_void_ptr *)0x0);
  if ((uStack_48 & 0x200000000) == 0) {
    uStack_48._0_7_ = CONCAT16(1,(undefined6)uStack_48);
  }
  else if (uStack_48._6_1_ != '\x01') {
    sqlite3VdbeMemTranslate((Mem *)&local_58,'\x01');
  }
  if (db->mallocFailed != '\0') {
    if (((uStack_48 & 0x900000000000) != 0) || ((int)uStack_38 != 0)) {
      vdbeMemClear((Mem *)&local_58);
    }
    pcStack_50 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pcStack_50;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE char *sqlite3Utf16to8(sqlite3 *db, const void *z, int nByte, u8 enc){
  Mem m;
  memset(&m, 0, sizeof(m));
  m.db = db;
  sqlite3VdbeMemSetStr(&m, z, nByte, enc, SQLITE_STATIC);
  sqlite3VdbeChangeEncoding(&m, SQLITE_UTF8);
  if( db->mallocFailed ){
    sqlite3VdbeMemRelease(&m);
    m.z = 0;
  }
  assert( (m.flags & MEM_Term)!=0 || db->mallocFailed );
  assert( (m.flags & MEM_Str)!=0 || db->mallocFailed );
  assert( m.z || db->mallocFailed );
  return m.z;
}